

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  pointer pcVar1;
  ostream *poVar2;
  GroupInfo *pGVar3;
  
  pGVar3 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
  if (pGVar3 == (GroupInfo *)0x0) {
    printSummaryDivider(this);
    poVar2 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Summary for group \'",0x13);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(_testGroupStats->groupInfo).name._M_dataplus._M_p,
                        (_testGroupStats->groupInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\':\n",3);
    printTotals(this,&_testGroupStats->totals);
    poVar2 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    pGVar3 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
    if (pGVar3 == (GroupInfo *)0x0) goto LAB_0013920c;
  }
  pcVar1 = (pGVar3->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(pGVar3->name).field_2) {
    operator_delete(pcVar1);
  }
LAB_0013920c:
  (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue = (GroupInfo *)0x0;
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( !unusedGroupInfo ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }